

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_> *
Vector<XOnlyPubKey>(vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_> *__return_storage_ptr__,
                   XOnlyPubKey *args)

{
  long lVar1;
  iterator __position;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined8 uVar6;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>::reserve(__return_storage_ptr__,1);
  __position._M_current =
       (__return_storage_ptr__->super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (__return_storage_ptr__->super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>::_M_realloc_insert<XOnlyPubKey>
              (__return_storage_ptr__,__position,args);
  }
  else {
    uVar2 = *(undefined4 *)(args->m_keydata).super_base_blob<256U>.m_data._M_elems;
    uVar3 = *(undefined4 *)((args->m_keydata).super_base_blob<256U>.m_data._M_elems + 4);
    uVar4 = *(undefined4 *)((args->m_keydata).super_base_blob<256U>.m_data._M_elems + 8);
    uVar5 = *(undefined4 *)((args->m_keydata).super_base_blob<256U>.m_data._M_elems + 0xc);
    uVar6 = *(undefined8 *)((args->m_keydata).super_base_blob<256U>.m_data._M_elems + 0x18);
    *(undefined8 *)
     (((__position._M_current)->m_keydata).super_base_blob<256U>.m_data._M_elems + 0x10) =
         *(undefined8 *)((args->m_keydata).super_base_blob<256U>.m_data._M_elems + 0x10);
    *(undefined8 *)
     (((__position._M_current)->m_keydata).super_base_blob<256U>.m_data._M_elems + 0x18) = uVar6;
    *(undefined4 *)((__position._M_current)->m_keydata).super_base_blob<256U>.m_data._M_elems =
         uVar2;
    *(undefined4 *)(((__position._M_current)->m_keydata).super_base_blob<256U>.m_data._M_elems + 4)
         = uVar3;
    *(undefined4 *)(((__position._M_current)->m_keydata).super_base_blob<256U>.m_data._M_elems + 8)
         = uVar4;
    *(undefined4 *)
     (((__position._M_current)->m_keydata).super_base_blob<256U>.m_data._M_elems + 0xc) = uVar5;
    (__return_storage_ptr__->super__Vector_base<XOnlyPubKey,_std::allocator<XOnlyPubKey>_>)._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

inline std::vector<typename std::common_type<Args...>::type> Vector(Args&&... args)
{
    std::vector<typename std::common_type<Args...>::type> ret;
    ret.reserve(sizeof...(args));
    // The line below uses the trick from https://www.experts-exchange.com/articles/32502/None-recursive-variadic-templates-with-std-initializer-list.html
    (void)std::initializer_list<int>{(ret.emplace_back(std::forward<Args>(args)), 0)...};
    return ret;
}